

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::WBClearObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,char *addr)

{
  ushort uVar1;
  code *pcVar2;
  byte *pbVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  uint uVar7;
  uchar retval;
  
  uVar6 = (int)addr - *(int *)&(this->super_HeapBlock).address;
  uVar1 = this->objectSize;
  if (uVar6 % (uint)uVar1 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.h"
                       ,0x275,"((uint)(addr - this->address) % this->objectSize == 0)",
                       "(uint)(addr - this->address) % this->objectSize == 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    uVar1 = this->objectSize;
    uVar6 = (int)addr - *(int *)&(this->super_HeapBlock).address;
  }
  if (7 < uVar1) {
    uVar6 = uVar6 >> 3;
    uVar7 = (uint)(uVar1 >> 3);
    do {
      BVStatic<4096UL>::AssertRange(&this->wbVerifyBits,uVar6);
      LOCK();
      pbVar3 = (byte *)((long)&(this->wbVerifyBits).data[0].word + ((long)(int)uVar6 >> 3));
      *pbVar3 = *pbVar3 & ~('\x01' << (uVar6 & 7));
      UNLOCK();
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

virtual void WBClearObject(char* addr) override
    {
        Assert((uint)(addr - this->address) % this->objectSize == 0);
        uint index = (uint)(addr - this->address) / sizeof(void*);
        uint count = (uint)(this->objectSize / sizeof(void*));
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.TestAndClearInterlocked(index + i);
        }
    }